

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

void Abc_NtkRestrashRandom_rec(Abc_Ntk_t *pNtk,Abc_Obj_t *pObj)

{
  Abc_Aig_t *pMan;
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *p1;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsNode(pObj);
    if (iVar1 != 0) {
      uVar2 = rand();
      if ((uVar2 & 1) == 0) {
        pAVar3 = Abc_ObjFanin1(pObj);
        Abc_NtkRestrashRandom_rec(pNtk,pAVar3);
        pAVar3 = Abc_ObjFanin0(pObj);
        Abc_NtkRestrashRandom_rec(pNtk,pAVar3);
      }
      else {
        pAVar3 = Abc_ObjFanin0(pObj);
        Abc_NtkRestrashRandom_rec(pNtk,pAVar3);
        pAVar3 = Abc_ObjFanin1(pObj);
        Abc_NtkRestrashRandom_rec(pNtk,pAVar3);
      }
      pMan = (Abc_Aig_t *)pNtk->pManFunc;
      pAVar3 = Abc_ObjChild0Copy(pObj);
      p1 = Abc_ObjChild1Copy(pObj);
      pAVar3 = Abc_AigAnd(pMan,pAVar3,p1);
      (pObj->field_6).pCopy = pAVar3;
    }
  }
  return;
}

Assistant:

void Abc_NtkRestrashRandom_rec( Abc_Ntk_t * pNtk, Abc_Obj_t * pObj )
{
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( !Abc_ObjIsNode(pObj) )
        return;
    if ( rand() & 1 )
    {
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin0(pObj) );
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin1(pObj) );
    }
    else
    {
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin1(pObj) );
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin0(pObj) );
    }
    pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
}